

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O1

void choice_dialog_stop_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object widget;
  Am_Value return_value;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Value local_18;
  
  Am_Object::Get_Object((Am_Object *)&local_18,(Am_Slot_Key)cmd,10);
  pAVar1 = Am_Object::Get((Am_Object *)&local_18,0x68,0);
  Am_Object::Am_Object(&local_28,pAVar1);
  Am_Object::~Am_Object((Am_Object *)&local_18);
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)&local_28,0x1ec);
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)&local_20,0x1ea);
  pAVar1 = Am_Object::Get(&local_30,0x169,0);
  Am_Value::Am_Value(&local_18,pAVar1);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)&local_28,0xc5);
  Am_Object::Set(&local_30,0x169,&local_18,0);
  Am_Object::~Am_Object(&local_30);
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, choice_dialog_stop, (Am_Object cmd))
{
  Am_Object widget = cmd.Get_Owner().Get(Am_WINDOW);
  Am_Value return_value = widget.Get_Object(Am_DIALOG_GROUP)
                              .Get_Object(Am_DIALOG_BUTTONS)
                              .Get(Am_VALUE);
  widget.Get_Object(Am_COMMAND).Set(Am_VALUE, return_value);
}